

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_parameter<int,_4,_trng::mrg4> *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  int *in_RSI;
  wistream *in_RDI;
  int i;
  fmtflags flags;
  mrg_parameter<int,_4,_trng::mrg4> P_new;
  delim_c *in_stack_ffffffffffffffa8;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_ffffffffffffffb0;
  wistream *in_00;
  int local_2c;
  mrg_parameter<int,_4,_trng::mrg4> local_20;
  int *local_10;
  wistream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_4,_trng::mrg4>::mrg_parameter(&local_20);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    std::wistream::operator>>(local_8,local_20.a + local_2c);
    if (local_2c + 1 < 4) {
      utility::delim('\0');
      utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  in_00 = local_8;
  utility::delim('\0');
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)in_00,
                      in_stack_ffffffffffffffa8);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *(undefined8 *)local_10 = local_20.a._0_8_;
    *(undefined8 *)(local_10 + 2) = local_20.a._8_8_;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }